

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O3

int select_reg(reg_state *state,int vreg,int loc,int src)

{
  uint uVar1;
  ldst_opi p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  arg_info_list paVar6;
  dill_stream pdVar7;
  int *piVar8;
  vreg_info *pvVar9;
  private_ctx pdVar10;
  ulong uVar11;
  dill_stream_conflict s;
  long lVar12;
  size_t size;
  preg_info *ppVar13;
  uint uVar14;
  bitv tmp_assigns [6];
  uint local_94;
  preg_info *local_78;
  uint local_6c;
  preg_info *local_68;
  dill_stream_conflict local_60;
  vreg_info *local_58;
  basic_block_conflict local_50;
  undefined1 local_48 [10];
  undefined6 uStack_3e;
  undefined2 uStack_38;
  undefined6 uStack_36;
  
  s = state->c;
  local_50 = state->bb;
  local_58 = s->p->vregs;
  local_78 = state->fpregs;
  local_68 = state->ipregs;
  iVar3 = dill_type_of(s,vreg);
  ppVar13 = (&state->fpregs)[1 < iVar3 - 9U];
  if (select_reg::reg_debug == -1) {
    pcVar5 = getenv("REG_DEBUG");
    select_reg::reg_debug = (int)(pcVar5 != (char *)0x0);
  }
  if (vreg < 100) {
    paVar6 = s->p->c_param_args;
    if (paVar6[vreg].is_register != '\0') {
      paVar6 = paVar6 + vreg;
      goto LAB_0011323c;
    }
  }
  else if (vreg == 100) {
    return s->dill_local_pointer;
  }
  iVar3 = dill_type_of(s,vreg);
  if (iVar3 == 0xc) {
    return -1;
  }
  pdVar10 = state->c->p;
  if (vreg < 100) {
    paVar6 = pdVar10->c_param_args;
    if (paVar6[vreg].is_register == '\0') {
      if (state->param_info[vreg].in_reg != -1) {
        iVar3 = state->param_info[vreg].in_reg;
        state->param_info[vreg].assign_loc = loc;
        if (src != 0) {
          return iVar3;
        }
        pvVar9 = state->param_info + vreg;
        goto LAB_00113849;
      }
    }
    else {
      paVar6 = paVar6 + vreg;
      if (paVar6->in_reg != -1) {
LAB_0011323c:
        return paVar6->in_reg;
      }
    }
  }
  else {
    pvVar9 = pdVar10->vregs;
    iVar3 = pvVar9[(ulong)(uint)vreg - 100].in_reg;
    if (iVar3 != -1) {
      pvVar9[(ulong)(uint)vreg - 100].assign_loc = loc;
      if (src != 0) {
        return iVar3;
      }
      pvVar9 = pvVar9 + ((ulong)(uint)vreg - 100);
LAB_00113849:
      pvVar9->update_in_reg = 1;
      return iVar3;
    }
  }
  local_48._0_2_ = 0x16;
  local_48._2_8_ = 0;
  uStack_3e = 0;
  uStack_38 = 0;
  uStack_36 = 0;
  if (select_reg::reg_debug != 0) {
    printf("Get assignment for vreg %d\n",(ulong)(uint)vreg);
  }
  iVar3 = dill_type_of(s,vreg);
  dill_raw_getreg(s,(dill_reg *)&local_6c,iVar3,0);
  if (local_6c == 0xffffffff) {
    local_94 = 0xffffffff;
  }
  else {
    local_94 = 0xffffffff;
    local_60 = s;
    do {
      uVar14 = local_6c;
      local_48[(long)((int)local_6c >> 3) + 2] =
           local_48[(long)((int)local_6c >> 3) + 2] | (byte)(1 << ((byte)local_6c & 7));
      if (select_reg::reg_debug != 0) {
        printf("checking preg %d\n",(ulong)local_6c);
      }
      if (state->reg_count <= (int)uVar14) {
        size = (long)(int)(uVar14 + 1) * 0x38;
        local_78 = (preg_info *)dill_realloc(local_78,size);
        local_68 = (preg_info *)dill_realloc(local_68,size);
        s = local_60;
        state->fpregs = local_78;
        state->ipregs = local_68;
        iVar3 = state->reg_count;
        if (iVar3 <= (int)uVar14) {
          lVar12 = 0;
          do {
            local_78[iVar3 + lVar12].holds = -1;
            local_68[iVar3 + lVar12].holds = -1;
            lVar12 = lVar12 + 1;
          } while ((uVar14 - iVar3) + 1 != (int)lVar12);
        }
        iVar3 = dill_type_of(local_60,vreg);
        ppVar13 = (&state->fpregs)[1 < iVar3 - 9U];
        state->reg_count = uVar14 + 1;
      }
      uVar1 = ppVar13[(int)uVar14].holds;
      uVar11 = (ulong)uVar1;
      if (uVar11 == 0xffffffff) {
        if (select_reg::reg_debug != 0) {
          pcVar5 = "preg %d empty, assigning to vreg %d\n";
          uVar11 = (ulong)(uint)vreg;
LAB_001136dc:
          printf(pcVar5,(ulong)uVar14,uVar11);
        }
LAB_001136e3:
        if (uVar14 != 0xffffffff) {
          local_94 = uVar14;
        }
        break;
      }
      pdVar10 = state->c->p;
      if ((int)uVar1 < 100) {
        if (pdVar10->c_param_args[(int)uVar1].is_register == '\0') {
          if ((src == 0) || (state->param_info[(int)uVar1].assign_loc != loc)) {
            pvVar9 = state->param_info + (int)uVar1;
            goto LAB_00113531;
          }
        }
        else {
          iVar3 = 0;
          if (src == 0 || loc != 0) goto LAB_00113533;
        }
LAB_00113503:
        if (select_reg::reg_debug != 0) {
          printf("preg %d assigned to vreg %d at this loc\n",(ulong)uVar14);
        }
      }
      else {
        if ((src != 0) && (pdVar10->vregs[uVar11 - 100].assign_loc == loc)) goto LAB_00113503;
        pvVar9 = pdVar10->vregs + (uVar11 - 100);
LAB_00113531:
        iVar3 = pvVar9->last_use;
LAB_00113533:
        if (iVar3 < loc) {
LAB_001136ca:
          if (select_reg::reg_debug != 0) {
            pcVar5 = "preg %d assigned to vreg %d, but that vreg is done, assigning\n";
            goto LAB_001136dc;
          }
          goto LAB_001136e3;
        }
        if (src == 0) {
          if ((int)uVar1 < 100) {
            iVar3 = 0;
            if (pdVar10->c_param_args[(int)uVar1].is_register == '\0') {
              pvVar9 = state->param_info + (int)uVar1;
              goto LAB_00113585;
            }
          }
          else {
            pvVar9 = pdVar10->vregs + (uVar11 - 100);
LAB_00113585:
            iVar3 = pvVar9->last_use;
          }
          if (iVar3 == loc) goto LAB_001136ca;
        }
        if (local_94 == 0xffffffff) {
          if (select_reg::reg_debug != 0) {
            pcVar5 = "preg %d is new tentative assign\n";
LAB_00113651:
            printf(pcVar5,(ulong)uVar14);
          }
LAB_0011365a:
          local_94 = uVar14;
        }
        else {
          lVar12 = (long)ppVar13[(int)local_94].holds;
          if (lVar12 < 100) {
            iVar3 = 0;
            if (pdVar10->c_param_args[lVar12].is_register == '\0') {
              pvVar9 = state->param_info + lVar12;
              goto LAB_001135f9;
            }
          }
          else {
            pvVar9 = pdVar10->vregs + lVar12 + -100;
LAB_001135f9:
            iVar3 = pvVar9->use_metric;
          }
          if ((int)uVar1 < 100) {
            iVar4 = 0;
            if (pdVar10->c_param_args[(int)uVar1].is_register == '\0') {
              pvVar9 = state->param_info + (int)uVar1;
              goto LAB_0011363a;
            }
          }
          else {
            pvVar9 = pdVar10->vregs + (long)(int)uVar1 + -100;
LAB_0011363a:
            iVar4 = pvVar9->use_metric;
          }
          if (iVar4 < iVar3) {
            if (select_reg::reg_debug != 0) {
              pcVar5 = "preg %d is better tentative assign\n";
              goto LAB_00113651;
            }
            goto LAB_0011365a;
          }
          if (select_reg::reg_debug != 0) {
            printf("previous assign %d was better tentative assign\n",(ulong)local_94);
          }
        }
      }
      iVar3 = dill_type_of(s,vreg);
      dill_raw_getreg(s,(dill_reg *)&local_6c,iVar3,0);
    } while (local_6c != 0xffffffff);
  }
  iVar3 = dill_type_of(s,vreg);
  foreach_bit((bit_vec)local_48,put_unless,s,(void *)((long)iVar3 << 0x18 | 0xffffff));
  if (local_94 == 0xffffffff) {
    pdVar7 = state->c;
  }
  else {
    uVar14 = ppVar13[(int)local_94].holds;
    lVar12 = (long)(int)uVar14;
    pdVar7 = state->c;
    if (lVar12 != -1) {
      if ((int)uVar14 < 100) {
        if (pdVar7->p->c_param_args[lVar12].is_register != '\0') goto LAB_0011396e;
        if (state->param_info[lVar12].update_in_reg != 0) {
          piVar8 = &s->p->c_param_args[lVar12].offset;
          goto LAB_00113807;
        }
LAB_00113954:
        pvVar9 = state->param_info + lVar12;
      }
      else {
        pvVar9 = pdVar7->p->vregs;
        if (((loc < pvVar9[lVar12 + -100].last_use) ||
            (((byte)local_50->live_at_end->vec[uVar14 - 100 >> 3] >> (uVar14 - 100 & 7) & 1) != 0))
           && (pvVar9[lVar12 + -100].update_in_reg != 0)) {
          piVar8 = &s->p->vregs[lVar12 + -100].offset;
LAB_00113807:
          iVar3 = *piVar8;
          iVar4 = dill_type_of(s,uVar14);
          pdVar10 = state->c->p;
          if ((int)uVar14 < 100) {
            if (pdVar10->c_param_args[lVar12].is_register == '\0') {
              pvVar9 = state->param_info + lVar12;
              goto LAB_00113876;
            }
          }
          else {
            pvVar9 = pdVar10->vregs + lVar12 + -100;
LAB_00113876:
            (&pvVar9->update_in_reg)[1] = 1;
            pvVar9->update_in_reg = 0;
          }
          if (iVar3 == -0x21524111) {
            iVar3 = (*s->j->local)(s,0,iVar4);
            local_58[lVar12 + -100].offset = iVar3;
          }
          if (select_reg::reg_debug != 0) {
            printf("Spilling vreg %d to memory, new assignment is %d\n",(ulong)uVar14,
                   (ulong)(uint)vreg);
          }
          p_Var2 = s->j->storei;
          if ((int)uVar14 < 100) {
            (*p_Var2)(s,iVar4,0,local_94,s->dill_param_reg_pointer,(long)iVar3);
            pdVar7 = state->c;
            if (pdVar7->p->c_param_args[lVar12].is_register != '\0') goto LAB_0011396e;
            goto LAB_00113954;
          }
          (*p_Var2)(s,iVar4,0,local_94,s->dill_local_pointer,(long)iVar3);
          pdVar7 = state->c;
          pvVar9 = pdVar7->p->vregs;
        }
        pvVar9 = pvVar9 + lVar12 + -100;
      }
      pvVar9->in_reg = -1;
    }
  }
LAB_0011396e:
  pdVar10 = pdVar7->p;
  if (src == 0) {
    if (vreg < 100) {
      if (pdVar10->c_param_args[vreg].is_register != '\0') goto LAB_00113b1e;
LAB_00113ae7:
      pvVar9 = state->param_info + vreg;
    }
    else {
LAB_001139ca:
      pvVar9 = pdVar10->vregs + ((ulong)(uint)vreg - 100);
    }
    pvVar9->update_in_reg = 1;
LAB_00113b1e:
    if (local_94 == 0xffffffff) {
      pdVar7 = state->c;
      pdVar10 = pdVar7->p;
      if (99 < vreg) goto LAB_00113bce;
      if (pdVar10->c_param_args[vreg].is_register != '\0') goto LAB_00113c52;
      pvVar9 = state->param_info + vreg;
LAB_00113be6:
      pvVar9->in_reg = -1;
      goto LAB_00113bec;
    }
    ppVar13[(int)local_94].holds = vreg;
    pdVar7 = state->c;
    pdVar10 = pdVar7->p;
    if (99 < vreg) goto LAB_00113b35;
    if (pdVar10->c_param_args[vreg].is_register == '\0') {
      pvVar9 = state->param_info + vreg;
      goto LAB_00113bb9;
    }
  }
  else {
    if (vreg < 100) {
      if (pdVar10->c_param_args[vreg].is_register != '\0') goto LAB_00113b1e;
      if (state->param_info[vreg].value_in_mem == 0) goto LAB_00113ae7;
      piVar8 = &s->p->c_param_args[vreg].offset;
    }
    else {
      if (pdVar10->vregs[(ulong)(uint)vreg - 100].value_in_mem == 0) goto LAB_001139ca;
      piVar8 = &s->p->vregs[(ulong)(uint)vreg - 100].offset;
    }
    uVar14 = *piVar8;
    iVar3 = dill_type_of(s,vreg);
    if (uVar14 == 0xdeadbeef) {
      uVar14 = 0;
      printf("Virtual register %d used as source but not previously assigned \n",(ulong)(uint)vreg);
    }
    if (select_reg::reg_debug != 0) {
      printf("Loading vreg %d from offset %d into preg %d\n",(ulong)(uint)vreg,(ulong)uVar14,
             (ulong)local_94);
    }
    p_Var2 = s->j->loadi;
    if (vreg < 100) {
      (*p_Var2)(s,iVar3,0,local_94,s->dill_param_reg_pointer,(long)(int)uVar14);
      goto LAB_00113b1e;
    }
    (*p_Var2)(s,iVar3,0,local_94,s->dill_local_pointer,(long)(int)uVar14);
    if (local_94 == 0xffffffff) {
      pdVar7 = state->c;
      pdVar10 = pdVar7->p;
LAB_00113bce:
      pvVar9 = pdVar10->vregs + ((ulong)(uint)vreg - 100);
      goto LAB_00113be6;
    }
    ppVar13[(int)local_94].holds = vreg;
    pdVar7 = state->c;
    pdVar10 = pdVar7->p;
LAB_00113b35:
    pvVar9 = pdVar10->vregs + ((ulong)(uint)vreg - 100);
LAB_00113bb9:
    pvVar9->in_reg = local_94;
LAB_00113bec:
    pdVar10 = pdVar7->p;
    if (99 < vreg) {
      pvVar9 = pdVar10->vregs;
      pvVar9[(ulong)(uint)vreg - 100].assign_loc = loc;
      if (src == 0) {
        return local_94;
      }
      if (local_94 != 0xffffffff) {
        return local_94;
      }
      if (pvVar9[(ulong)(uint)vreg - 100].value_in_mem != 0) {
        return -1;
      }
      piVar8 = &s->p->vregs[(ulong)(uint)vreg - 100].offset;
      goto LAB_00113c96;
    }
  }
LAB_00113c52:
  if (pdVar10->c_param_args[vreg].is_register == '\0') {
    state->param_info[vreg].assign_loc = loc;
    if (src == 0) {
      return local_94;
    }
    if (local_94 != 0xffffffff) {
      return local_94;
    }
    if (state->param_info[vreg].value_in_mem != 0) {
      return -1;
    }
  }
  else {
    if (src == 0) {
      return local_94;
    }
    if (local_94 != 0xffffffff) {
      return local_94;
    }
  }
  piVar8 = &s->p->c_param_args[vreg].offset;
LAB_00113c96:
  uVar14 = *piVar8;
  iVar3 = dill_type_of(s,vreg);
  if (select_reg::reg_debug != 0) {
    printf("Special x86 loading vreg %d from offset %d into preg %d\n",(ulong)(uint)vreg,
           (ulong)uVar14,0xffffffff);
  }
  if (vreg < 100) {
    iVar4 = s->dill_param_reg_pointer;
  }
  else {
    iVar4 = s->dill_local_pointer;
  }
  (*s->j->loadi)(s,iVar3,0,-1,iVar4,(long)(int)uVar14);
  return -1;
}

Assistant:

static int
select_reg(reg_state* state, int vreg, int loc, int src)
{
    static int reg_debug = -1;
    int ret_reg = -1;
    int old_vreg = -1;
    vreg_info* vregs = state->c->p->vregs;
    dill_stream c = state->c;
    basic_block bb = state->bb;
    preg_info* pregs;
    preg_info* fpregs = state->fpregs;
    preg_info* ipregs = state->ipregs;
    switch (dill_type_of(c, vreg)) {
    case DILL_F:
    case DILL_D:
        pregs = state->fpregs;
        break;
    default:
        pregs = state->ipregs;
        break;
    }
    if (reg_debug == -1) {
        reg_debug = (getenv("REG_DEBUG") != NULL);
    }
    if (vreg < 100) {
        /* parameter */
        if (c->p->c_param_args[vreg].is_register) {
            return c->p->c_param_args[vreg].in_reg;
        }
    }
    if (vreg == 100) {
        return dill_lp(c);
    }
    if (dill_type_of(c, vreg) == DILL_B) {
        /* not really using this */
        return -1;
    }
    if (get_in_reg(state, vreg) != -1) {
        ret_reg = get_in_reg(state, vreg);
        set_assign_loc(state, vreg, loc);
        if (!src)
            set_update_in_reg(state, vreg, 1);
        return ret_reg;
    } else {
        int preg;
        struct bitv tmp_assigns[6];
        int tentative_assign = -1;
        init_bit_vec(&tmp_assigns[0], sizeof(tmp_assigns));
        if (reg_debug)
            printf("Get assignment for vreg %d\n", vreg);
        while ((preg = get_tentative_assign(c, vreg, &tmp_assigns[0])) != -1) {
            int used_vreg;
            if (reg_debug)
                printf("checking preg %d\n", preg);
            if (preg >= state->reg_count) {
                int i;
                fpregs = realloc(fpregs, sizeof(reg_state) * (preg + 1));
                ipregs = realloc(ipregs, sizeof(reg_state) * (preg + 1));
                state->fpregs = fpregs;
                state->ipregs = ipregs;
                for (i = state->reg_count; i <= preg; i++) {
                    ipregs[i].holds = fpregs[i].holds = -1;
                }
                switch (dill_type_of(c, vreg)) {
                case DILL_F:
                case DILL_D:
                    pregs = state->fpregs;
                    break;
                default:
                    pregs = state->ipregs;
                    break;
                }
                state->reg_count = preg + 1;
            }
            used_vreg = pregs[preg].holds;
            if (used_vreg == -1) {
                ret_reg = preg;
                if (reg_debug)
                    printf("preg %d empty, assigning to vreg %d\n", preg, vreg);
                break;
            }
            if ((get_assign_loc(state, used_vreg) == loc) && src) {
                if (reg_debug)
                    printf("preg %d assigned to vreg %d at this loc\n", preg,
                           used_vreg);
                continue;
            }
            if ((get_last_use(state, used_vreg) < loc) ||
                (!src && (get_last_use(state, used_vreg) == loc))) {
                ret_reg = preg;
                if (reg_debug)
                    printf(
                        "preg %d assigned to vreg %d, but that vreg is done, "
                        "assigning\n",
                        preg, used_vreg);
                break;
            }
            if (tentative_assign == -1) {
                tentative_assign = preg;
                if (reg_debug)
                    printf("preg %d is new tentative assign\n", preg);
            } else if (get_use_metric(state, pregs[tentative_assign].holds) >
                       get_use_metric(state, used_vreg)) {
                if (reg_debug)
                    printf("preg %d is better tentative assign\n", preg);
                tentative_assign = preg;
            } else {
                if (reg_debug)
                    printf("previous assign %d was better tentative assign\n",
                           tentative_assign);
            }
        }
        if (ret_reg == -1)
            ret_reg = tentative_assign;
        put_tentative_assigns(c, -1, &tmp_assigns[0], dill_type_of(c, vreg));
    }
    if (ret_reg != -1)
        old_vreg = pregs[ret_reg].holds;
    if (old_vreg != -1) {
        /* if this is not the same as the old assignment */
        if (((get_last_use(state, old_vreg) > loc) ||
             live_at_end(bb, old_vreg)) &&
            update_in_reg(state, old_vreg)) {
            int offset = offset_of(c, old_vreg);
            int typ = dill_type_of(c, old_vreg);
            set_value_in_mem(state, old_vreg, 1);
            set_update_in_reg(state, old_vreg, 0);
            if (offset == 0xdeadbeef) {
                /* not previously spilled */
                offset = vregs[old_vreg - 100].offset = dill_local(c, typ);
            }
            /* spill vreg to memory */
            if (reg_debug)
                printf("Spilling vreg %d to memory, new assignment is %d\n",
                       old_vreg, vreg);
            if (old_vreg >= 100) {
                c->j->storei(c, typ, 0, ret_reg, c->dill_local_pointer, offset);
            } else {
                c->j->storei(c, typ, 0, ret_reg, c->dill_param_reg_pointer,
                             offset);
            }
        }
        set_in_reg(state, old_vreg, -1);
    }
    if (src && value_in_mem(state, vreg)) {
        int offset = offset_of(c, vreg);
        int typ = dill_type_of(c, vreg);
        if (offset == 0xdeadbeef) {
            /* not previously assigned */
            printf(
                "Virtual register %d used as source but not previously "
                "assigned \n",
                vreg);
            offset = 0;
        }
        if (reg_debug)
            printf("Loading vreg %d from offset %d into preg %d\n", vreg,
                   offset, ret_reg);
        if (vreg >= 100) {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_local_pointer, offset);
        } else {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_param_reg_pointer, offset);
        }
    } else {
        set_update_in_reg(state, vreg, 1);
    }
    if (ret_reg != -1)
        pregs[ret_reg].holds = vreg;
    set_in_reg(state, vreg, ret_reg);
    set_assign_loc(state, vreg, loc);
    if (src && (ret_reg == -1) && !value_in_mem(state, vreg)) {
        /* special x86 no float regs case */
        int offset = offset_of(c, vreg);
        int typ = dill_type_of(c, vreg);
        if (reg_debug)
            printf("Special x86 loading vreg %d from offset %d into preg %d\n",
                   vreg, offset, ret_reg);
        if (vreg >= 100) {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_local_pointer, offset);
        } else {
            c->j->loadi(c, typ, 0, ret_reg, c->dill_param_reg_pointer, offset);
        }
    }
    return ret_reg;
}